

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract.h
# Opt level: O1

void __thiscall
ContractFrameProtector::ContractFrameProtector(ContractFrameProtector *this,char *name)

{
  ContractFrame *pCVar1;
  
  pCVar1 = g_contract_current_frame;
  if (g_contract_frames == (ContractFrame *)0x0) {
    __assert_fail("g_contract_frames != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/contract.h"
                  ,0x49,"ContractFrameProtector::ContractFrameProtector(const char *)");
  }
  if (g_contract_current_frame != (ContractFrame *)0x0) {
    g_contract_current_frame = (ContractFrame *)operator_new(0x18);
    g_contract_current_frame->restrictions = None;
    g_contract_current_frame->function_name = name;
    g_contract_current_frame->parent = pCVar1;
    this->protected_frame = g_contract_current_frame;
    return;
  }
  __assert_fail("g_contract_current_frame != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/contract.h"
                ,0x4a,"ContractFrameProtector::ContractFrameProtector(const char *)");
}

Assistant:

ContractFrameProtector(const char *name) {
    assert(g_contract_frames != nullptr);
    assert(g_contract_current_frame != nullptr);
    ContractFrame *frame = new ContractFrame(name, g_contract_current_frame);
    g_contract_current_frame = frame;
    protected_frame = frame;
  }